

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MilStorage.cpp
# Opt level: O0

u_int64_t __thiscall
CoreML::MilStoragePython::MilStoragePythonWriter::write_uint3_data
          (MilStoragePythonWriter *this,array_t<unsigned_char,_16> *data)

{
  type m_writer;
  u_int64_t uVar1;
  array_t<unsigned_char,_16> *data_local;
  MilStoragePythonWriter *this_local;
  
  m_writer = std::
             unique_ptr<MILBlob::Blob::StorageWriter,_std::default_delete<MILBlob::Blob::StorageWriter>_>
             ::operator*(&this->m_writer);
  uVar1 = anon_unknown.dwarf_392cf::writeUnsignedSubByteData<MILBlob::UInt3>(m_writer,data);
  return uVar1;
}

Assistant:

u_int64_t MilStoragePythonWriter::write_uint3_data(const py::array_t<uint8_t>& data) {
    return writeUnsignedSubByteData<MILBlob::UInt3>(*m_writer, data);
}